

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::clauseOr(SelectionCompiler *this)

{
  bool bVar1;
  int iVar2;
  SelectionCompiler *in_RDI;
  Token tokenOr;
  undefined7 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffcc;
  SelectionCompiler *in_stack_ffffffffffffffd8;
  SelectionCompiler *in_stack_ffffffffffffffe8;
  byte local_1;
  
  bVar1 = clauseAnd(in_stack_ffffffffffffffe8);
  if (bVar1) {
    while (iVar2 = tokPeek((SelectionCompiler *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)),
          iVar2 == 0x404) {
      tokenNext(in_stack_ffffffffffffffd8);
      bVar1 = clauseAnd(in_stack_ffffffffffffffe8);
      if (bVar1) {
        addTokenToPostfix(in_RDI,(Token *)CONCAT17(bVar1,in_stack_ffffffffffffffb8));
      }
      else {
        local_1 = 0;
      }
      uVar3 = (uint)!bVar1;
      Token::~Token((Token *)0x37e1c2);
      if (uVar3 != 0) goto LAB_0037e1d8;
      in_stack_ffffffffffffffc8 = 0;
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
LAB_0037e1d8:
  return (bool)(local_1 & 1);
}

Assistant:

bool SelectionCompiler::clauseOr() {
    if (!clauseAnd()) { return false; }

    while (tokPeek() == Token::opOr) {
      Token tokenOr = tokenNext();
      if (!clauseAnd()) { return false; }
      addTokenToPostfix(tokenOr);
    }
    return true;
  }